

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::create_directory(path *p,error_code *ec)

{
  bool bVar1;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  bVar1 = create_directory(p,(path *)&local_30,ec);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

GHC_INLINE bool create_directory(const path& p, std::error_code& ec) noexcept
{
    return create_directory(p, path(), ec);
}